

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precond.c
# Opt level: O0

Vector * JacobiPrecond(QMatrix *A,Vector *y,Vector *c,double Omega)

{
  QMatrix *Q;
  Vector *pVVar1;
  double Omega_local;
  Vector *c_local;
  Vector *y_local;
  QMatrix *A_local;
  
  Q_Lock(A);
  V_Lock(y);
  V_Lock(c);
  Q = Diag_Q(A);
  pVVar1 = MulInv_QV(Q,c);
  pVVar1 = Mul_SV(Omega,pVVar1);
  Asgn_VV(y,pVVar1);
  Q_Unlock(A);
  V_Unlock(y);
  V_Unlock(c);
  return y;
}

Assistant:

Vector *JacobiPrecond(QMatrix *A, Vector *y, Vector *c, double Omega)
/* Jacobi preconditioner */
{
    Q_Lock(A);
    V_Lock(y);
    V_Lock(c);

    /*
     *  Diag(A) / Omega y = c
     *
     *  y = Omega Diag(A)^(-1) c
     */
     
    Asgn_VV(y, Mul_SV(Omega, MulInv_QV(Diag_Q(A), c)));

    Q_Unlock(A);
    V_Unlock(y);
    V_Unlock(c);

    return(y);
}